

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_all.cc
# Opt level: O3

int i2d_PKCS8_PRIV_KEY_INFO_bio(BIO *bp,PKCS8_PRIV_KEY_INFO *p8inf)

{
  uint uVar1;
  int iVar2;
  uint8_t *data;
  uchar *local_10;
  
  local_10 = (uchar *)0x0;
  uVar1 = i2d_PKCS8_PRIV_KEY_INFO(p8inf,&local_10);
  if ((int)uVar1 < 0) {
    iVar2 = 0;
  }
  else {
    iVar2 = BIO_write_all((BIO *)bp,local_10,(ulong)uVar1);
    OPENSSL_free(local_10);
  }
  return iVar2;
}

Assistant:

int i2d_PKCS8PrivateKeyInfo_bio(BIO *bp, EVP_PKEY *key) {
  PKCS8_PRIV_KEY_INFO *p8inf;
  int ret;
  p8inf = EVP_PKEY2PKCS8(key);
  if (!p8inf) {
    return 0;
  }
  ret = i2d_PKCS8_PRIV_KEY_INFO_bio(bp, p8inf);
  PKCS8_PRIV_KEY_INFO_free(p8inf);
  return ret;
}